

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void __thiscall
QTextDocumentLayoutPrivate::drawFrame
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextFrame *frame)

{
  QRectF *clip;
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  QFixed *pQVar9;
  QPointer<QTextFrame> *pQVar10;
  QRectF cellRect;
  Iterator it;
  QRectF cellRect_00;
  long lVar11;
  bool bVar12;
  int iVar13;
  QFixed QVar14;
  QFixed QVar15;
  int iVar16;
  uint uVar17;
  QTextFrameData *fd;
  QPoint QVar18;
  QDebug *pQVar19;
  QTextTable *this_00;
  QTextTableData *this_01;
  QTextTable *pQVar20;
  QTextFrameData *pQVar21;
  const_iterator cVar22;
  QTextFrame *pQVar23;
  QPen *p;
  QColor *color;
  QTextLayout *this_02;
  int c_1;
  long lVar24;
  int iVar25;
  int iVar26;
  int col;
  QTextCursor *this_03;
  parameter_type t;
  undefined8 *puVar27;
  PaintContext *pPVar28;
  int c;
  QFixed b;
  int c_00;
  long lVar29;
  int i;
  ulong uVar30;
  ulong uVar31;
  long in_FS_OFFSET;
  byte bVar32;
  double dVar33;
  double dVar34;
  QPointF QVar35;
  QSizeF QVar36;
  int local_5ac;
  int col_start;
  undefined4 uStack_544;
  double dStack_540;
  undefined4 local_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  int num_cols;
  undefined1 local_518 [32];
  QPointF local_4f8;
  QPointF local_4e8;
  QPointF local_4d8;
  int row_start;
  undefined4 uStack_4c4;
  int iStack_4c0;
  int iStack_4bc;
  ColorGroup local_4b8;
  undefined4 uStack_4b4;
  int iStack_4b0;
  int num_rows;
  undefined4 uStack_474;
  undefined1 *puStack_470;
  QTextBlock local_468;
  QVarLengthArray<int,_256LL> selectedTableCells;
  
  bVar32 = 0;
  lVar8 = *(long *)(in_FS_OFFSET + 0x28);
  fd = ::data(frame);
  if (fd->layoutDirty == false) {
    QVar35 = QFixedPoint::toPointF(&fd->position);
    selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a =
         (qsizetype)(QVar35.xp + offset->xp);
    selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s =
         (qsizetype)(QVar35.yp + offset->yp);
    QVar18 = QPointF::toPoint((QPointF *)&selectedTableCells);
    dVar33 = (double)QVar18.xp.m_i.m_i;
    dVar34 = (double)QVar18.yp.m_i.m_i;
    clip = &context->clip;
    dVar1 = (context->clip).w;
    local_4d8.xp = dVar33;
    local_4d8.yp = dVar34;
    if (((dVar1 <= 0.0) || (dVar2 = (context->clip).h, dVar2 <= 0.0)) ||
       ((dVar3 = (context->clip).yp, dVar34 <= dVar2 + dVar3 &&
        (((dVar3 <= (double)(fd->size).height.val * 0.015625 + dVar34 &&
          (dVar33 <= dVar1 + clip->xp)) &&
         (clip->xp <= (double)(fd->size).width.val * 0.015625 + dVar33)))))) {
      lcDraw();
      if (((byte)lcDraw::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._0_4_ = 2;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._0_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_ = 0;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._0_4_ = Active;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_ = 0;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array._0_4_ =
             SUB84(lcDraw::category.name,0);
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array._4_4_ =
             SUB84((ulong)lcDraw::category.name >> 0x20,0);
        QMessageLogger::debug();
        pQVar19 = QDebug::operator<<((QDebug *)&row_start,"drawFrame");
        iVar13 = QTextFrame::firstPosition(frame);
        pQVar19 = QDebug::operator<<(pQVar19,iVar13);
        pQVar19 = QDebug::operator<<(pQVar19,"--");
        iVar13 = QTextFrame::lastPosition(frame);
        pQVar19 = QDebug::operator<<(pQVar19,iVar13);
        pQVar19 = QDebug::operator<<(pQVar19,"at");
        local_4e8.xp = (qreal)pQVar19->stream;
        ((Stream *)local_4e8.xp)->ref = ((Stream *)local_4e8.xp)->ref + 1;
        ::operator<<((QDebug *)&local_4e8.yp,&local_4e8);
        QDebug::~QDebug((QDebug *)&local_4e8.yp);
        QDebug::~QDebug((QDebug *)&local_4e8);
        QDebug::~QDebug((QDebug *)&row_start);
      }
      local_468.p = (QTextDocumentPrivate *)0x0;
      local_468.n = 0;
      local_468._12_4_ = 0xaaaaaaaa;
      local_4f8.xp = local_4d8.xp;
      local_4f8.yp = local_4d8.yp;
      this_00 = QtPrivate::qobject_cast_helper<QTextTable*,QObject>((QObject *)frame);
      local_518._16_16_ = (undefined1  [16])QFixedSize::toSizeF(&fd->size);
      local_518._0_8_ = dVar33;
      local_518._8_8_ = dVar34;
      if (this_00 == (QTextTable *)0x0) {
        drawFrameDecoration(this,painter,frame,fd,clip,(QRectF *)local_518);
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._0_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[0] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[1] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[2] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[3] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[4] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[5] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[6] = -0x56;
        selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[7] = -0x56;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._0_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._0_4_ = -0x55555556;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_ = -0x55555556;
        QTextFrame::begin((iterator *)&selectedTableCells,frame);
        pQVar23 = QTextDocumentPrivate::rootFrame
                            ((this->super_QAbstractTextDocumentLayoutPrivate).docPrivate);
        if (pQVar23 == frame) {
          frameIteratorForYPosition
                    ((Iterator *)&row_start,this,(QFixed)(int)((context->clip).yp * 64.0));
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._0_4_ = local_4b8;
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_ = uStack_4b4;
          selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[0] = (undefined1)iStack_4b0;
          selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[1] = iStack_4b0._1_1_;
          selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[2] = iStack_4b0._2_1_;
          selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[3] = iStack_4b0._3_1_;
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._0_4_ = SUB84(_row_start,0);
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_ =
               (undefined4)((ulong)_row_start >> 0x20);
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._0_4_ = iStack_4c0;
          selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_ = iStack_4bc;
        }
        local_4b8 = Active;
        uStack_4b4 = 0;
        _row_start = (Stream *)0x0;
        iStack_4c0 = 0;
        iStack_4bc = 0;
        uVar30 = (fd->floats).d.size;
        iVar13 = (int)uVar30;
        QList<QTextFrame_*>::reserve((QList<QTextFrame_*> *)&row_start,(long)iVar13);
        uVar31 = 0;
        uVar30 = uVar30 & 0xffffffff;
        if (iVar13 < 1) {
          uVar30 = uVar31;
        }
        for (; uVar30 * 0x10 != uVar31; uVar31 = uVar31 + 0x10) {
          pQVar10 = (fd->floats).d.ptr;
          lVar24 = *(long *)((long)&(pQVar10->wp).d + uVar31);
          if ((lVar24 == 0) || (*(int *)(lVar24 + 4) == 0)) {
            t = (parameter_type)0x0;
          }
          else {
            t = *(parameter_type *)((long)&(pQVar10->wp).value + uVar31);
          }
          QList<QTextFrame_*>::append((QList<QTextFrame_*> *)&row_start,t);
        }
        it.cf._4_4_ = selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_;
        it.cf._0_4_ = (ColorGroup)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr;
        it._28_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[4];
        it._29_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[5];
        it._30_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[6];
        it._31_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[7];
        it.cb._0_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[0];
        it.cb._1_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[1];
        it.cb._2_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[2];
        it.cb._3_1_ = selectedTableCells.super_QVLAStorage<4UL,_4UL,_256LL>.array[3];
        it.f._4_4_ = selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_;
        it.f._0_4_ = (undefined4)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a;
        it.b = (int)selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s;
        it.e = selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.s._4_4_;
        drawFlow(this,&local_4d8,painter,context,it,(QList<QTextFrame_*> *)&row_start,&local_468);
        QArrayDataPointer<QTextFrame_*>::~QArrayDataPointer
                  ((QArrayDataPointer<QTextFrame_*> *)&row_start);
      }
      else {
        local_5ac = QTextTable::rows(this_00);
        iVar13 = QTextTable::columns(this_00);
        this_01 = (QTextTableData *)::data(&this_00->super_QTextFrame);
        memset(&selectedTableCells,0xaa,0x418);
        QVarLengthArray<int,_256LL>::QVarLengthArray
                  (&selectedTableCells,(context->selections).d.size << 2);
        lVar24 = 0xc;
        lVar29 = 0;
        for (uVar30 = 0; uVar30 < (ulong)(context->selections).d.size; uVar30 = uVar30 + 1) {
          row_start = 0xffffffff;
          _col_start = (double)CONCAT44(uStack_544,0xffffffff);
          _num_rows = (QTextTable *)CONCAT44(uStack_474,0xffffffff);
          this_03 = (QTextCursor *)((long)&(((context->selections).d.ptr)->cursor).d.d.ptr + lVar29)
          ;
          num_cols = -1;
          pQVar20 = QTextCursor::currentTable(this_03);
          if (pQVar20 == this_00) {
            QTextCursor::selectedTableCells(this_03,&row_start,&num_rows,&col_start,&num_cols);
          }
          lVar11 = CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr._4_4_,
                            (ColorGroup)
                            selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr);
          *(int *)(lVar11 + -0xc + lVar24) = row_start;
          *(int *)(lVar11 + -8 + lVar24) = col_start;
          *(int *)(lVar11 + -4 + lVar24) = num_rows;
          *(int *)(lVar11 + lVar24) = num_cols;
          lVar24 = lVar24 + 0x10;
          lVar29 = lVar29 + 0x18;
        }
        QVar36 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
        iVar25 = (int)(QVar36.ht * 64.0);
        num_cols = (this_01->super_QTextFrameData).position.y.val;
        pQVar20 = this_00;
        while( true ) {
          pQVar20 = (QTextTable *)QTextFrame::parentFrame(&pQVar20->super_QTextFrame);
          if (pQVar20 == (QTextTable *)0x0) break;
          pQVar21 = ::data((QTextFrame *)pQVar20);
          num_cols = num_cols + (pQVar21->position).y.val;
        }
        b.val = 0x1fffffc0;
        if (0 < iVar25) {
          b.val = iVar25;
        }
        QVar14 = QFixed::operator/((QFixed *)&num_cols,b);
        row_start = num_cols + (this_01->super_QTextFrameData).size.height.val;
        QVar15 = QFixed::operator/((QFixed *)&row_start,b);
        if (this_01->borderCollapse == false) {
          drawFrameDecoration(this,painter,frame,fd,clip,(QRectF *)local_518);
        }
        iVar26 = QVar14.val >> 6;
        QTextTable::format((QTextTable *)&row_start);
        iVar16 = QTextTableFormat::headerRowCount((QTextTableFormat *)&row_start);
        iVar25 = local_5ac + -1;
        if (iVar16 < local_5ac + -1) {
          iVar25 = iVar16;
        }
        QTextFormat::~QTextFormat((QTextFormat *)&row_start);
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (iVar25 < 1) {
          iVar25 = 0;
        }
        while (iVar16 = (int)this_00, iVar26 < QVar15.val >> 6) {
          iVar26 = iVar26 + 1;
          iVar4 = (this_01->super_QTextFrameData).effectiveTopMargin.val;
          iVar5 = (this_01->cellSpacing).val;
          iVar6 = (this_01->super_QTextFrameData).border.val;
          iVar7 = ((this_01->rowPositions).d.ptr)->val;
          for (col = 0; col != iVar25; col = col + 1) {
            for (c_00 = 0; iVar13 != c_00; c_00 = c_00 + 1) {
              _num_rows = (QTextTable *)&DAT_aaaaaaaaaaaaaaaa;
              puStack_470 = &DAT_aaaaaaaaaaaaaaaa;
              QTextTable::cellAt((QTextTable *)&num_rows,iVar16,col);
              puVar27 = &DAT_005fb6b8;
              pPVar28 = (PaintContext *)&row_start;
              for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
                *(undefined8 *)pPVar28 = *puVar27;
                puVar27 = puVar27 + (ulong)bVar32 * -2 + 1;
                pPVar28 = (PaintContext *)((long)pPVar28 + (ulong)bVar32 * -0x10 + 8);
              }
              QAbstractTextDocumentLayout::PaintContext::PaintContext
                        ((PaintContext *)&row_start,context);
              adjustContextSelectionsForCell
                        ((PaintContext *)&row_start,(QTextTableCell *)&num_rows,col,c_00,
                         (int *)CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.
                                         ptr._4_4_,
                                         (ColorGroup)
                                         selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.
                                         ptr));
              local_538 = 0xffffffff;
              uStack_534 = 0xffffffff;
              uStack_530 = 0xffffffff;
              uStack_52c = 0xffffffff;
              _col_start = -NAN;
              dStack_540 = -NAN;
              QTextTableData::cellRect((QRectF *)&col_start,this_01,(QTextTableCell *)&num_rows);
              _col_start = _col_start + dVar33;
              dStack_540 = dStack_540 +
                           (double)((iVar26 * b.val + iVar4 + iVar5 + iVar6) - iVar7) * 0.015625;
              cellRect.w._4_4_ = uStack_534;
              cellRect.w._0_4_ = local_538;
              cellRect.h._4_4_ = uStack_52c;
              cellRect.h._0_4_ = uStack_530;
              cellRect.yp._0_4_ = SUB84(dStack_540,0);
              cellRect.xp = _col_start;
              cellRect.yp._4_4_ = (int)((ulong)dStack_540 >> 0x20);
              bVar12 = cellClipTest(this_00,this_01,(PaintContext *)&row_start,
                                    (QTextTableCell *)&num_rows,cellRect);
              if (!bVar12) {
                drawTableCell(this,(QRectF *)&col_start,painter,(PaintContext *)&row_start,this_00,
                              this_01,col,c_00,&local_468,&local_4f8);
              }
              QAbstractTextDocumentLayout::PaintContext::~PaintContext((PaintContext *)&row_start);
            }
          }
        }
        iVar25 = 0;
        if (((context->clip).w <= 0.0) || ((context->clip).h <= 0.0)) {
          uVar30 = 0;
        }
        else {
          pQVar9 = (this_01->rowPositions).d.ptr;
          row_start = (int)(((context->clip).yp - dVar34) * 64.0);
          cVar22 = std::
                   __lower_bound<QList<QFixed>::const_iterator,QFixed,__gnu_cxx::__ops::_Iter_less_val>
                             (pQVar9,pQVar9 + (this_01->rowPositions).d.size,&row_start);
          pQVar9 = (this_01->rowPositions).d.ptr;
          uVar30 = (ulong)((long)cVar22.i + (-4 - (long)pQVar9)) >> 2 & 0xffffffff;
          if (cVar22.i == pQVar9 + (this_01->rowPositions).d.size) {
            uVar30 = 0;
          }
          if (cVar22.i == pQVar9) {
            uVar30 = 0;
          }
          row_start = (int)((((context->clip).yp + (context->clip).h) - dVar34) * 64.0);
          cVar22 = std::
                   __upper_bound<QList<QFixed>::const_iterator,QFixed,__gnu_cxx::__ops::_Val_less_iter>
                             (pQVar9,pQVar9 + (this_01->rowPositions).d.size,&row_start);
          pQVar9 = (this_01->rowPositions).d.ptr;
          if (cVar22.i != pQVar9 + (this_01->rowPositions).d.size) {
            local_5ac = (int)((ulong)((long)cVar22.i + (4 - (long)pQVar9)) >> 2);
          }
        }
        for (; iVar13 != iVar25; iVar25 = iVar25 + 1) {
          _row_start = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
          iStack_4c0 = -0x55555556;
          iStack_4bc = -0x55555556;
          QTextTable::cellAt((QTextTable *)&row_start,iVar16,(int)uVar30);
          uVar17 = QTextTableCell::row((QTextTableCell *)&row_start);
          if ((int)uVar17 <= (int)uVar30) {
            uVar30 = (ulong)uVar17;
          }
        }
        while (iVar25 = (int)uVar30, iVar25 < local_5ac) {
          for (iVar26 = 0; iVar13 != iVar26; iVar26 = iVar26 + 1) {
            _num_rows = (QTextTable *)&DAT_aaaaaaaaaaaaaaaa;
            puStack_470 = &DAT_aaaaaaaaaaaaaaaa;
            QTextTable::cellAt((QTextTable *)&num_rows,iVar16,iVar25);
            puVar27 = &DAT_005fb6b8;
            pPVar28 = (PaintContext *)&row_start;
            for (lVar24 = 10; lVar24 != 0; lVar24 = lVar24 + -1) {
              *(undefined8 *)pPVar28 = *puVar27;
              puVar27 = puVar27 + (ulong)bVar32 * -2 + 1;
              pPVar28 = (PaintContext *)((long)pPVar28 + (ulong)bVar32 * -0x10 + 8);
            }
            QAbstractTextDocumentLayout::PaintContext::PaintContext
                      ((PaintContext *)&row_start,context);
            adjustContextSelectionsForCell
                      ((PaintContext *)&row_start,(QTextTableCell *)&num_rows,iVar25,iVar26,
                       (int *)CONCAT44(selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.ptr
                                       ._4_4_,(ColorGroup)
                                              selectedTableCells.super_QVLABase<int>.
                                              super_QVLABaseBase.ptr));
            local_538 = 0xffffffff;
            uStack_534 = 0xffffffff;
            uStack_530 = 0xffffffff;
            uStack_52c = 0xffffffff;
            _col_start = -NAN;
            dStack_540 = -NAN;
            QTextTableData::cellRect((QRectF *)&col_start,this_01,(QTextTableCell *)&num_rows);
            _col_start = _col_start + dVar33;
            dStack_540 = dStack_540 + dVar34;
            cellRect_00.w._4_4_ = uStack_534;
            cellRect_00.w._0_4_ = local_538;
            cellRect_00.h._4_4_ = uStack_52c;
            cellRect_00.h._0_4_ = uStack_530;
            cellRect_00.yp._0_4_ = SUB84(dStack_540,0);
            cellRect_00.xp = _col_start;
            cellRect_00.yp._4_4_ = (int)((ulong)dStack_540 >> 0x20);
            bVar12 = cellClipTest(this_00,this_01,(PaintContext *)&row_start,
                                  (QTextTableCell *)&num_rows,cellRect_00);
            if (!bVar12) {
              drawTableCell(this,(QRectF *)&col_start,painter,(PaintContext *)&row_start,this_00,
                            this_01,iVar25,iVar26,&local_468,&local_4f8);
            }
            QAbstractTextDocumentLayout::PaintContext::~PaintContext((PaintContext *)&row_start);
          }
          uVar30 = (ulong)(iVar25 + 1);
        }
        QVarLengthArray<int,_256LL>::~QVarLengthArray(&selectedTableCells);
      }
      bVar12 = QTextBlock::isValid(&local_468);
      if (bVar12) {
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._0_4_ = 0xaaaaaaaa;
        selectedTableCells.super_QVLABase<int>.super_QVLABaseBase.a._4_4_ = 0xaaaaaaaa;
        p = QPainter::pen(painter);
        QPen::QPen((QPen *)&selectedTableCells,p);
        color = QPalette::color(&context->palette,Text);
        QPainter::setPen(painter,color);
        iVar13 = context->cursorPosition;
        iVar25 = QTextBlock::position(&local_468);
        this_02 = QTextBlock::layout(&local_468);
        QTextLayout::drawCursor(this_02,painter,&local_4f8,iVar13 - iVar25,this->cursorWidth);
        QPainter::setPen(painter,(QPen *)&selectedTableCells);
        QPen::~QPen((QPen *)&selectedTableCells);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawFrame(const QPointF &offset, QPainter *painter,
                                           const QAbstractTextDocumentLayout::PaintContext &context,
                                           QTextFrame *frame) const
{
    QTextFrameData *fd = data(frame);
    // #######
    if (fd->layoutDirty)
        return;
    Q_ASSERT(!fd->sizeDirty);
    Q_ASSERT(!fd->layoutDirty);

    // floor the offset to avoid painting artefacts when drawing adjacent borders
    // we later also round table cell heights and widths
    const QPointF off = QPointF(QPointF(offset + fd->position.toPointF()).toPoint());

    if (context.clip.isValid()
        && (off.y() > context.clip.bottom() || off.y() + fd->size.height.toReal() < context.clip.top()
            || off.x() > context.clip.right() || off.x() + fd->size.width.toReal() < context.clip.left()))
        return;

     qCDebug(lcDraw) << "drawFrame" << frame->firstPosition() << "--" << frame->lastPosition() << "at" << offset;

    // if the cursor is /on/ a table border we may need to repaint it
    // afterwards, as we usually draw the decoration first
    QTextBlock cursorBlockNeedingRepaint;
    QPointF offsetOfRepaintedCursorBlock = off;

    QTextTable *table = qobject_cast<QTextTable *>(frame);
    const QRectF frameRect(off, fd->size.toSizeF());

    if (table) {
        const int rows = table->rows();
        const int columns = table->columns();
        QTextTableData *td = static_cast<QTextTableData *>(data(table));

        QVarLengthArray<int> selectedTableCells(context.selections.size() * 4);
        for (int i = 0; i < context.selections.size(); ++i) {
            const QAbstractTextDocumentLayout::Selection &s = context.selections.at(i);
            int row_start = -1, col_start = -1, num_rows = -1, num_cols = -1;

            if (s.cursor.currentTable() == table)
                s.cursor.selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

            selectedTableCells[i * 4] = row_start;
            selectedTableCells[i * 4 + 1] = col_start;
            selectedTableCells[i * 4 + 2] = num_rows;
            selectedTableCells[i * 4 + 3] = num_cols;
        }

        QFixed pageHeight = QFixed::fromReal(document->pageSize().height());
        if (pageHeight <= 0)
            pageHeight = QFIXED_MAX;

        QFixed absYPos = td->position.y;
        QTextFrame *parentFrame = table->parentFrame();
        while (parentFrame) {
            absYPos += data(parentFrame)->position.y;
            parentFrame = parentFrame->parentFrame();
        }
        const int tableStartPage = (absYPos / pageHeight).truncate();
        const int tableEndPage = ((absYPos + td->size.height) / pageHeight).truncate();

        // for borderCollapse draw frame decoration by drawing the outermost
        // cell edges with width = td->border
        if (!td->borderCollapse)
            drawFrameDecoration(painter, frame, fd, context.clip, frameRect);

        // draw the repeated table headers for table continuation after page breaks
        const int headerRowCount = qMin(table->format().headerRowCount(), rows - 1);
        int page = tableStartPage + 1;
        while (page <= tableEndPage) {
            const QFixed pageTop = page * pageHeight + td->effectiveTopMargin + td->cellSpacing + td->border;
            const qreal headerOffset = (pageTop - td->rowPositions.at(0)).toReal();
            for (int r = 0; r < headerRowCount; ++r) {
                for (int c = 0; c < columns; ++c) {
                    QTextTableCell cell = table->cellAt(r, c);
                    QAbstractTextDocumentLayout::PaintContext cell_context = context;
                    adjustContextSelectionsForCell(cell_context, cell, r, c, selectedTableCells.data());
                    QRectF cellRect = td->cellRect(cell);

                    cellRect.translate(off.x(), headerOffset);
                    if (cellClipTest(table, td, cell_context, cell, cellRect))
                        continue;

                    drawTableCell(cellRect, painter, cell_context, table, td, r, c, &cursorBlockNeedingRepaint,
                                  &offsetOfRepaintedCursorBlock);
                }
            }
            ++page;
        }

        int firstRow = 0;
        int lastRow = rows;

        if (context.clip.isValid()) {
            auto rowIt = std::lower_bound(td->rowPositions.constBegin(), td->rowPositions.constEnd(), QFixed::fromReal(context.clip.top() - off.y()));
            if (rowIt != td->rowPositions.constEnd() && rowIt != td->rowPositions.constBegin()) {
                --rowIt;
                firstRow = rowIt - td->rowPositions.constBegin();
            }

            rowIt = std::upper_bound(td->rowPositions.constBegin(), td->rowPositions.constEnd(), QFixed::fromReal(context.clip.bottom() - off.y()));
            if (rowIt != td->rowPositions.constEnd()) {
                ++rowIt;
                lastRow = rowIt - td->rowPositions.constBegin();
            }
        }

        for (int c = 0; c < columns; ++c) {
            QTextTableCell cell = table->cellAt(firstRow, c);
            firstRow = qMin(firstRow, cell.row());
        }

        for (int r = firstRow; r < lastRow; ++r) {
            for (int c = 0; c < columns; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                QAbstractTextDocumentLayout::PaintContext cell_context = context;
                adjustContextSelectionsForCell(cell_context, cell, r, c, selectedTableCells.data());
                QRectF cellRect = td->cellRect(cell);

                cellRect.translate(off);
                if (cellClipTest(table, td, cell_context, cell, cellRect))
                    continue;

                drawTableCell(cellRect, painter, cell_context, table, td, r, c, &cursorBlockNeedingRepaint,
                              &offsetOfRepaintedCursorBlock);
            }
        }

    } else {
        drawFrameDecoration(painter, frame, fd, context.clip, frameRect);

        QTextFrame::Iterator it = frame->begin();

        if (frame == docPrivate->rootFrame())
            it = frameIteratorForYPosition(QFixed::fromReal(context.clip.top()));

        QList<QTextFrame *> floats;
        const int numFloats = fd->floats.size();
        floats.reserve(numFloats);
        for (int i = 0; i < numFloats; ++i)
            floats.append(fd->floats.at(i));

        drawFlow(off, painter, context, it, floats, &cursorBlockNeedingRepaint);
    }

    if (cursorBlockNeedingRepaint.isValid()) {
        const QPen oldPen = painter->pen();
        painter->setPen(context.palette.color(QPalette::Text));
        const int cursorPos = context.cursorPosition - cursorBlockNeedingRepaint.position();
        cursorBlockNeedingRepaint.layout()->drawCursor(painter, offsetOfRepaintedCursorBlock,
                                                       cursorPos, cursorWidth);
        painter->setPen(oldPen);
    }

    return;
}